

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

bool __thiscall mpt::encode_array::shift(encode_array *this,size_t len)

{
  ulong __n;
  size_t sVar1;
  void *__dest;
  size_t shift;
  uint8_t *d;
  size_t len_1;
  size_t max;
  size_t len_local;
  encode_array *this_local;
  
  if (len == 0) {
    __n = (this->_state).done + (this->_state).scratch;
    sVar1 = array::length(&this->_d);
    if (sVar1 <= __n) {
      this_local._7_1_ = false;
    }
    else {
      __dest = array::base(&this->_d);
      memcpy(__dest,(void *)((long)__dest + ((sVar1 <= __n) - __n)),__n);
      array::set(&this->_d,__n,(void *)0x0);
      this_local._7_1_ = true;
    }
  }
  else if ((this->_state).done < len) {
    this_local._7_1_ = false;
  }
  else {
    (this->_state).done = (this->_state).done - len;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool encode_array::shift(size_t len)
{
	// move data segment to front
	if (!len) {
		size_t max, len = _state.done + _state.scratch;
		if ((max = _d.length() <= len)) {
			return false;
		}
		uint8_t *d = reinterpret_cast<uint8_t *>(_d.base());
		size_t shift = max - len;
		memcpy(d, d + shift, len);
		_d.set(len);
		return true;
	}
	// consume terminated data
	if (len > _state.done) {
		return false;
	}
	_state.done -= len;
	return true;
}